

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spR<PredictionData<double,int>,int>
                 (PredictionData<double,_int> *prediction_data,int *row_st,int *row_end,
                 size_t col_num)

{
  int *piVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *search_res;
  int *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_RDX == in_RSI) {
    local_8 = 0.0;
  }
  else {
    piVar1 = std::lower_bound<int_const*,int>(in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    if ((piVar1 == in_RDX) || (*piVar1 != (int)in_RCX)) {
      local_8 = 0.0;
    }
    else {
      local_8 = *(double *)
                 (*(long *)(in_RDI + 0x48) + ((long)piVar1 - *(long *)(in_RDI + 0x50) >> 2) * 8);
    }
  }
  return local_8;
}

Assistant:

double extract_spR(const PredictionData &prediction_data, const sparse_ix *row_st, const sparse_ix *row_end, size_t col_num) noexcept
{
    if (row_end == row_st)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}